

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O2

void __thiscall
TextFile::writeFormat<long,std::__cxx11::string>
          (TextFile *this,char *text,long *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  void *__buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string message;
  string local_30;
  
  tinyformat::format<long,std::__cxx11::string>
            (&local_30,(tinyformat *)text,(char *)args,(long *)args_1,in_R8);
  write(this,(int)&local_30,__buf,(size_t)args_1);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void writeFormat(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		write(message);
	}